

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNewNsProp(void)

{
  int iVar1;
  int iVar2;
  xmlNodePtr val;
  xmlNsPtr val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlAttrPtr val_03;
  int local_54;
  int n_value;
  xmlChar *value;
  int n_name;
  xmlChar *name;
  int n_ns;
  xmlNsPtr ns;
  int n_node;
  xmlNodePtr node;
  xmlAttrPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (ns._4_4_ = 0; (int)ns._4_4_ < 3; ns._4_4_ = ns._4_4_ + 1) {
    for (name._4_4_ = 0; (int)name._4_4_ < 2; name._4_4_ = name._4_4_ + 1) {
      for (value._4_4_ = 0; (int)value._4_4_ < 5; value._4_4_ = value._4_4_ + 1) {
        for (local_54 = 0; local_54 < 5; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlNodePtr(ns._4_4_,0);
          val_00 = gen_xmlNsPtr(name._4_4_,1);
          val_01 = gen_const_xmlChar_ptr(value._4_4_,2);
          val_02 = gen_const_xmlChar_ptr(local_54,3);
          val_03 = (xmlAttrPtr)xmlNewNsProp(val,val_00,val_01,val_02);
          desret_xmlAttrPtr(val_03);
          call_tests = call_tests + 1;
          des_xmlNodePtr(ns._4_4_,val,0);
          des_xmlNsPtr(name._4_4_,val_00,1);
          des_const_xmlChar_ptr(value._4_4_,val_01,2);
          des_const_xmlChar_ptr(local_54,val_02,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewNsProp",(ulong)(uint)(iVar2 - iVar1));
            ret_val._4_4_ = ret_val._4_4_ + 1;
            printf(" %d",(ulong)ns._4_4_);
            printf(" %d",(ulong)name._4_4_);
            printf(" %d",(ulong)value._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlNewNsProp(void) {
    int test_ret = 0;

    int mem_base;
    xmlAttrPtr ret_val;
    xmlNodePtr node; /* the parent node (optional) */
    int n_node;
    xmlNsPtr ns; /* the namespace (optional) */
    int n_ns;
    const xmlChar * name; /* the local name of the attribute */
    int n_name;
    const xmlChar * value; /* the value of the attribute (optional) */
    int n_value;

    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_ns = 0;n_ns < gen_nb_xmlNsPtr;n_ns++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_value = 0;n_value < gen_nb_const_xmlChar_ptr;n_value++) {
        mem_base = xmlMemBlocks();
        node = gen_xmlNodePtr(n_node, 0);
        ns = gen_xmlNsPtr(n_ns, 1);
        name = gen_const_xmlChar_ptr(n_name, 2);
        value = gen_const_xmlChar_ptr(n_value, 3);

        ret_val = xmlNewNsProp(node, ns, name, value);
        desret_xmlAttrPtr(ret_val);
        call_tests++;
        des_xmlNodePtr(n_node, node, 0);
        des_xmlNsPtr(n_ns, ns, 1);
        des_const_xmlChar_ptr(n_name, name, 2);
        des_const_xmlChar_ptr(n_value, value, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNewNsProp",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_node);
            printf(" %d", n_ns);
            printf(" %d", n_name);
            printf(" %d", n_value);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}